

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialog::setBar(QProgressDialog *this,QProgressBar *bar)

{
  QProgressDialogPrivate *pQVar1;
  QProgressBar *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QProgressDialogPrivate *d;
  char *in_stack_ffffffffffffff98;
  int line;
  QWidget *in_stack_ffffffffffffffb8;
  QProgressDialogPrivate *in_stack_ffffffffffffffc0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QProgressDialog *)0x7b180a);
  line = (int)((ulong)pQVar1 >> 0x20);
  if (in_RSI == (QProgressBar *)0x0) {
    QMessageLogger::QMessageLogger(in_RDI,(char *)0x0,line,in_stack_ffffffffffffff98);
    QMessageLogger::warning(local_28,"QProgressDialog::setBar: Cannot set a null progress bar");
  }
  else if (in_RSI == pQVar1->bar) {
    QMessageLogger::QMessageLogger(in_RDI,(char *)in_RSI,line,in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (&stack0xffffffffffffffb8,
               "QProgressDialog::setBar: Attempt to set the same progress bar again");
  }
  else {
    if (pQVar1->bar != (QProgressBar *)0x0) {
      (**(code **)(*(long *)&pQVar1->bar->super_QWidget + 0x20))();
    }
    pQVar1->bar = in_RSI;
    QProgressDialogPrivate::adoptChildWidget(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::setBar(QProgressBar *bar)
{
    Q_D(QProgressDialog);
    if (Q_UNLIKELY(!bar)) {
        qWarning("QProgressDialog::setBar: Cannot set a null progress bar");
        return;
    }
#ifndef QT_NO_DEBUG
    if (Q_UNLIKELY(value() > 0))
        qWarning("QProgressDialog::setBar: Cannot set a new progress bar "
                  "while the old one is active");
#endif
    if (Q_UNLIKELY(bar == d->bar)) {
        qWarning("QProgressDialog::setBar: Attempt to set the same progress bar again");
        return;
    }
    delete d->bar;
    d->bar = bar;
    d->adoptChildWidget(bar);
}